

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

void __thiscall
duckdb::CardinalityEstimator::UpdateTotalDomains
          (CardinalityEstimator *this,optional_ptr<duckdb::JoinRelationSet,_true> set,
          RelationStats *stats)

{
  idx_t iVar1;
  pointer pRVar2;
  pointer pDVar3;
  iterator iVar4;
  ulong uVar5;
  ulong uVar6;
  pointer __ht;
  ulong uVar7;
  ColumnBinding key;
  column_binding_set_t i_set;
  optional_ptr<duckdb::JoinRelationSet,_true> local_88;
  _AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,_true>_>_> local_80;
  key_type local_78;
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_88.ptr = set.ptr;
  optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_88);
  if ((stats->column_distinct_count).
      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (stats->column_distinct_count).
      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar1 = *(unsigned_long *)
             ((local_88.ptr)->relations).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
    uVar7 = 0;
    do {
      pRVar2 = (this->relations_to_tdoms).
               super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
               super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_78.table_index = iVar1;
      local_78.column_index = uVar7;
      for (__ht = (this->relations_to_tdoms).
                  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                  ._M_impl.super__Vector_impl_data._M_start; __ht != pRVar2; __ht = __ht + 1) {
        local_68._M_buckets = (__buckets_ptr)0x0;
        local_68._M_bucket_count = (__ht->equivalent_relations)._M_h._M_bucket_count;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = (__ht->equivalent_relations)._M_h._M_element_count;
        local_68._M_rehash_policy._M_max_load_factor =
             (__ht->equivalent_relations)._M_h._M_rehash_policy._M_max_load_factor;
        local_68._M_rehash_policy._4_4_ =
             *(undefined4 *)&(__ht->equivalent_relations)._M_h._M_rehash_policy.field_0x4;
        local_68._M_rehash_policy._M_next_resize =
             (__ht->equivalent_relations)._M_h._M_rehash_policy._M_next_resize;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        local_80._M_h = (__hashtable_alloc *)&local_68;
        ::std::
        _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign<std::_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
                  ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,
                   (_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)__ht,&local_80);
        iVar4 = ::std::
                _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_68,&local_78);
        if (iVar4.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur !=
            (__node_type *)0x0) {
          pDVar3 = (stats->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(stats->column_distinct_count).
                            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                            .
                            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 4) <= uVar7
             ) {
            ::std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar7);
          }
          uVar5 = pDVar3[uVar7].distinct_count;
          if ((*(bool *)((long)(pDVar3 + uVar7) + 8) & 1U) == 0) {
            uVar6 = __ht->tdom_no_hll;
            if (uVar5 < __ht->tdom_no_hll) {
              uVar6 = uVar5;
            }
            __ht->tdom_no_hll = uVar6;
          }
          else {
            if (__ht->has_tdom_hll == true) {
              if (uVar5 < __ht->tdom_hll) {
                uVar5 = __ht->tdom_hll;
              }
            }
            else {
              __ht->has_tdom_hll = true;
            }
            __ht->tdom_hll = uVar5;
          }
          ::std::
          _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_68);
          break;
        }
        ::std::
        _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_68);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(stats->column_distinct_count).
                                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                   .
                                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(stats->column_distinct_count).
                                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                   .
                                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return;
}

Assistant:

void CardinalityEstimator::UpdateTotalDomains(optional_ptr<JoinRelationSet> set, RelationStats &stats) {
	D_ASSERT(set->count == 1);
	auto relation_id = set->relations[0];
	//! Initialize the distinct count for all columns used in joins with the current relation.
	//	D_ASSERT(stats.column_distinct_count.size() >= 1);

	for (idx_t i = 0; i < stats.column_distinct_count.size(); i++) {
		//! for every column used in a filter in the relation, get the distinct count via HLL, or assume it to be
		//! the cardinality
		// Update the relation_to_tdom set with the estimated distinct count (or tdom) calculated above
		auto key = ColumnBinding(relation_id, i);
		for (auto &relation_to_tdom : relations_to_tdoms) {
			column_binding_set_t i_set = relation_to_tdom.equivalent_relations;
			if (i_set.find(key) == i_set.end()) {
				continue;
			}
			auto distinct_count = stats.column_distinct_count.at(i);
			if (distinct_count.from_hll && relation_to_tdom.has_tdom_hll) {
				relation_to_tdom.tdom_hll = MaxValue(relation_to_tdom.tdom_hll, distinct_count.distinct_count);
			} else if (distinct_count.from_hll && !relation_to_tdom.has_tdom_hll) {
				relation_to_tdom.has_tdom_hll = true;
				relation_to_tdom.tdom_hll = distinct_count.distinct_count;
			} else {
				relation_to_tdom.tdom_no_hll = MinValue(distinct_count.distinct_count, relation_to_tdom.tdom_no_hll);
			}
			break;
		}
	}
}